

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cobs.h
# Opt level: O0

size_t cobs_encode(uint8_t *input,size_t length,uint8_t *output)

{
  size_t sVar1;
  uint8_t local_39;
  size_t sStack_38;
  uint8_t code;
  size_t code_index;
  size_t write_index;
  size_t read_index;
  uint8_t *output_local;
  size_t length_local;
  uint8_t *input_local;
  
  code_index = 1;
  sStack_38 = 0;
  local_39 = '\x01';
  for (write_index = 0; write_index < length; write_index = write_index + 1) {
    if (input[write_index] == '\0') {
      output[sStack_38] = local_39;
      local_39 = '\x01';
      sStack_38 = code_index;
      sVar1 = code_index + 1;
    }
    else {
      output[code_index] = input[write_index];
      local_39 = local_39 + '\x01';
      sVar1 = code_index + 1;
      if (local_39 == 0xff) {
        output[sStack_38] = 0xff;
        local_39 = '\x01';
        sStack_38 = code_index + 1;
        sVar1 = code_index + 2;
      }
    }
    code_index = sVar1;
  }
  output[sStack_38] = local_39;
  return code_index;
}

Assistant:

size_t cobs_encode(const uint8_t *  input, size_t length, uint8_t *  output)
{
  size_t read_index = 0;
  size_t write_index = 1;
  size_t code_index = 0;
  uint8_t code = 1;

  while(read_index < length)
  {
    if(input[read_index] == 0)
    {
      output[code_index] = code;
      code = 1;
      code_index = write_index++;
      read_index++;
    }
    else
    {
      output[write_index++] = input[read_index++];
      code++;

      if(code == 0xFF)
      {
        output[code_index] = code;
        code = 1;
        code_index = write_index++;
      }
    }
  }

  output[code_index] = code;

  return write_index;
}